

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

void __thiscall
cxxopts::values::
abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~abstract_value(abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Atomic_word *p_Var2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int iVar5;
  
  (this->super_Value)._vptr_Value = (_func_int **)&PTR__abstract_value_0013a6c8;
  pcVar3 = (this->m_implicit_value)._M_dataplus._M_p;
  paVar1 = &(this->m_implicit_value).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->m_default_value)._M_dataplus._M_p;
  paVar1 = &(this->m_default_value).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  p_Var4 = (this->m_result).
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  p_Var4 = (this->super_Value).super_enable_shared_from_this<cxxopts::Value>._M_weak_this.
           super___weak_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2 = &p_Var4->_M_weak_count;
      iVar5 = *p_Var2;
      *p_Var2 = *p_Var2 + -1;
      UNLOCK();
    }
    else {
      iVar5 = p_Var4->_M_weak_count;
      p_Var4->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*p_Var4->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

virtual ~abstract_value() = default;